

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_difference_iterator.hpp
# Opt level: O2

void __thiscall
burst::
symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
::increment(symmetric_difference_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
            *this)

{
  faze(this);
  settle(this);
  return;
}

Assistant:

void increment ()
        {
            faze();
            settle();
        }